

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

void Fra_SmlSavePattern(Fra_Man_t *p)

{
  sat_solver *s;
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pObj_00;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Fra_Man_t *p_local;
  
  memset(p->pPatWords,0,(long)p->nPatWords << 2);
  for (local_1c = 0; iVar2 = Vec_PtrSize(p->pManFraig->vCis), local_1c < iVar2;
      local_1c = local_1c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pManFraig->vCis,local_1c);
    s = p->pSat;
    iVar2 = Fra_ObjSatNum(pObj_00);
    iVar2 = sat_solver_var_value(s,iVar2);
    if (iVar2 != 0) {
      Abc_InfoSetBit(p->pPatWords,local_1c);
    }
  }
  if (p->vCex != (Vec_Int_t *)0x0) {
    Vec_IntClear(p->vCex);
    local_1c = 0;
    while( true ) {
      iVar2 = Aig_ManCiNum(p->pManAig);
      iVar3 = Aig_ManRegNum(p->pManAig);
      if (iVar2 - iVar3 <= local_1c) break;
      pVVar1 = p->vCex;
      iVar2 = Abc_InfoHasBit(p->pPatWords,local_1c);
      Vec_IntPush(pVVar1,iVar2);
      local_1c = local_1c + 1;
    }
    local_1c = Aig_ManCiNum(p->pManFraig);
    iVar2 = Aig_ManRegNum(p->pManFraig);
    for (local_1c = local_1c - iVar2; iVar2 = Aig_ManCiNum(p->pManFraig), local_1c < iVar2;
        local_1c = local_1c + 1) {
      pVVar1 = p->vCex;
      iVar2 = Abc_InfoHasBit(p->pPatWords,local_1c);
      Vec_IntPush(pVVar1,iVar2);
    }
  }
  return;
}

Assistant:

void Fra_SmlSavePattern( Fra_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Aig_ManForEachCi( p->pManFraig, pObj, i )
//        if ( p->pSat->model.ptr[Fra_ObjSatNum(pObj)] == l_True )
        if ( sat_solver_var_value(p->pSat, Fra_ObjSatNum(pObj)) )
            Abc_InfoSetBit( p->pPatWords, i );

    if ( p->vCex )
    {
        Vec_IntClear( p->vCex );
        for ( i = 0; i < Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig); i++ )
            Vec_IntPush( p->vCex, Abc_InfoHasBit( p->pPatWords, i ) );
        for ( i = Aig_ManCiNum(p->pManFraig) - Aig_ManRegNum(p->pManFraig); i < Aig_ManCiNum(p->pManFraig); i++ )
            Vec_IntPush( p->vCex, Abc_InfoHasBit( p->pPatWords, i ) );
    }

/*
    printf( "Pattern: " );
    Aig_ManForEachCi( p->pManFraig, pObj, i )
        printf( "%d", Abc_InfoHasBit( p->pPatWords, i ) );
    printf( "\n" );
*/
}